

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O1

string * Kumu::PathMakeAbsolute(string *__return_storage_ptr__,string *Path,char separator)

{
  string *tmpstr;
  PathCompList_t out_list;
  PathCompList_t in_list;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  string local_58;
  string local_38;
  
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  if (Path->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,0,0,'\x01');
  }
  else if (*(Path->_M_dataplus)._M_p == separator) {
    PathMakeCanonical(__return_storage_ptr__,Path,'/');
  }
  else {
    local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
    local_70._M_impl._M_node._M_size = 0;
    local_88._M_impl._M_node._M_size = 0;
    local_70._M_impl._M_node.super__List_node_base._M_prev =
         local_70._M_impl._M_node.super__List_node_base._M_next;
    PathCwd_abi_cxx11_();
    PathJoin(&local_38,&local_58,Path,'/');
    PathToComponents(&local_38,(PathCompList_t *)&local_70,'/');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    make_canonical_list((PathCompList_t *)&local_70,(PathCompList_t *)&local_88);
    ComponentsToAbsolutePath(__return_storage_ptr__,(PathCompList_t *)&local_88,'/');
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_88);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
Kumu::PathMakeAbsolute(const std::string& Path, char separator)
{
  if ( Path.empty() )
    {
      std::string tmpstr;
      tmpstr = separator;
      return tmpstr;
    }

  if ( PathIsAbsolute(Path, separator) )
    return PathMakeCanonical(Path);

  PathCompList_t in_list, out_list;
  PathToComponents(PathJoin(PathCwd(), Path), in_list);
  make_canonical_list(in_list, out_list);

  return ComponentsToAbsolutePath(out_list);
}